

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void __thiscall
kratos::SystemVerilogCodeGen::SystemVerilogCodeGen
          (SystemVerilogCodeGen *this,Generator *generator,SystemVerilogCodeGenOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  this->_vptr_SystemVerilogCodeGen = (_func_int **)&PTR_dispatch_node_002af4e0;
  this->indent_size = 2;
  this->indent_ = 0;
  (this->empty_indent_str_)._M_dataplus._M_p = (pointer)&(this->empty_indent_str_).field_2;
  (this->empty_indent_str_)._M_string_length = 0;
  (this->empty_indent_str_).field_2._M_local_buf[0] = '\0';
  (this->empty_indent_string_view_)._M_len = 0;
  (this->empty_indent_string_view_)._M_str = (char *)0x0;
  this->generator_ = generator;
  this->skip_indent_ = false;
  (this->label_index_)._M_h._M_buckets = &(this->label_index_)._M_h._M_single_bucket;
  (this->label_index_)._M_h._M_bucket_count = 1;
  (this->label_index_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->label_index_)._M_h._M_element_count = 0;
  (this->label_index_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->label_index_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->label_index_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar5 = options->yosys_src;
  (this->options_).unique_case = options->unique_case;
  (this->options_).yosys_src = bVar5;
  paVar2 = &(this->options_).package_name.field_2;
  (this->options_).package_name._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (options->package_name)._M_dataplus._M_p;
  paVar1 = &(options->package_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&(options->package_name).field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->options_).package_name.field_2 + 8) = uVar4;
  }
  else {
    (this->options_).package_name._M_dataplus._M_p = pcVar3;
    (this->options_).package_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->options_).package_name._M_string_length = (options->package_name)._M_string_length;
  (options->package_name)._M_dataplus._M_p = (pointer)paVar1;
  (options->package_name)._M_string_length = 0;
  (options->package_name).field_2._M_local_buf[0] = '\0';
  (this->options_).line_wrap = options->line_wrap;
  paVar2 = &(this->options_).output_dir.field_2;
  (this->options_).output_dir._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (options->output_dir)._M_dataplus._M_p;
  paVar1 = &(options->output_dir).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&(options->output_dir).field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->options_).output_dir.field_2 + 8) = uVar4;
  }
  else {
    (this->options_).output_dir._M_dataplus._M_p = pcVar3;
    (this->options_).output_dir.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->options_).output_dir._M_string_length = (options->output_dir)._M_string_length;
  (options->output_dir)._M_dataplus._M_p = (pointer)paVar1;
  (options->output_dir)._M_string_length = 0;
  (options->output_dir).field_2._M_local_buf[0] = '\0';
  (this->options_).extract_debug_info = options->extract_debug_info;
  Stream::Stream(&this->stream_,generator,this);
  if (((generator->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (generator->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && ((generator->is_external_ & 1U) == 0)) {
    index_named_block_abi_cxx11_
              ((unordered_map<kratos::StmtBlock_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::StmtBlock_*>,_std::equal_to<kratos::StmtBlock_*>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_68,this);
    std::
    _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_move_assign(&(this->label_index_)._M_h,&local_68);
    std::
    _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    check_yosys_src(this);
  }
  return;
}

Assistant:

SystemVerilogCodeGen::SystemVerilogCodeGen(kratos::Generator* generator,
                                           SystemVerilogCodeGenOptions options)
    : generator_(generator), options_(std::move(options)), stream_(generator, this) {
    // if it's an external file, we don't output anything
    if (generator->external()) return;

    // index the named blocks
    label_index_ = index_named_block();

    // check if we need to inline src attribute with yosys
    check_yosys_src();
}